

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

int32_t ures_getFunctionalEquivalent_63
                  (char *result,int32_t resultCapacity,char *path,char *resName,char *keyword,
                  char *locid,UBool *isAvailable,UBool omitDefault,UErrorCode *status)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  UEnumeration *en;
  char *pcVar5;
  UResourceBundle *pUVar6;
  UChar *pUVar7;
  size_t sVar8;
  size_t sVar9;
  UBool UVar10;
  int32_t x;
  bool bVar11;
  UErrorCode subStatus;
  int32_t defLen;
  int32_t local_1dec;
  UChar *local_1de8;
  char *local_1de0;
  char *local_1dd8;
  char *local_1dd0;
  UResourceBundle bund1;
  UResourceBundle bund2;
  char full [1024];
  char found [1024];
  char kwVal [1024];
  char defVal [1024];
  char defLoc [1024];
  char parent [1024];
  char base [1024];
  
  local_1dd8 = resName;
  memset(kwVal,0,0x400);
  memset(defVal,0,0x400);
  memset(defLoc,0,0x400);
  memset(base,0,0x400);
  memset(full,0,0x400);
  subStatus = U_ZERO_ERROR;
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  local_1dd0 = result;
  uloc_getKeywordValue_63(locid,keyword,kwVal,0x3ff,&subStatus);
  if (CONCAT71(kwVal._1_7_,kwVal[0]) == 0x746c7561666564) {
    kwVal[0] = '\0';
  }
  uloc_getBaseName_63(locid,base,0x3ff,&subStatus);
  memset(&bund1,0,200);
  memset(&bund2,0,200);
  strcpy(parent,base);
  strcpy(found,base);
  if (isAvailable != (UBool *)0x0) {
    en = ures_openAvailableLocales_63(path,&subStatus);
    *isAvailable = '\x01';
    if (subStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      local_1dec = resultCapacity;
      local_1de0 = keyword;
      do {
        UVar10 = '\0';
        pcVar5 = uenum_next_63(en,(int32_t *)0x0,&subStatus);
        if (pcVar5 == (char *)0x0) goto LAB_002dad92;
        iVar2 = strcmp(pcVar5,parent);
      } while (iVar2 != 0);
      UVar10 = '\x01';
LAB_002dad92:
      *isAvailable = UVar10;
      keyword = local_1de0;
      resultCapacity = local_1dec;
    }
    uenum_close_63(en);
  }
  if (U_ZERO_ERROR < subStatus) {
    *status = subStatus;
    return 0;
  }
  local_1dec = resultCapacity;
  local_1de0 = keyword;
  do {
    subStatus = U_ZERO_ERROR;
    pUVar6 = ures_open_63(path,parent,&subStatus);
    if (isAvailable == (UBool *)0x0 ||
        (subStatus & ~U_ILLEGAL_ARGUMENT_ERROR) != U_ERROR_WARNING_START) {
      if (subStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((((subStatus == U_ZERO_ERROR) &&
             (ures_getByKey_63(pUVar6,local_1dd8,&bund1,&subStatus), subStatus == U_ZERO_ERROR)) &&
            (pUVar7 = ures_getStringByKey_63(&bund1,"default",&defLen,&subStatus),
            subStatus < U_ILLEGAL_ARGUMENT_ERROR)) && (defLen != 0)) {
          iVar4 = u_strlen_63(pUVar7);
          u_UCharsToChars_63(pUVar7,defVal,iVar4);
          strcpy(defLoc,parent);
          if (kwVal[0] == '\0') {
            strcpy(kwVal,defVal);
          }
        }
      }
      else {
        *status = subStatus;
      }
    }
    else {
      *isAvailable = '\0';
    }
    subStatus = U_ZERO_ERROR;
    if (pUVar6 != (UResourceBundle *)0x0) {
      strcpy(found,pUVar6->fTopLevelData->fName);
    }
    uloc_getParent_63(found,parent,0x400,&subStatus);
    ures_close_63(pUVar6);
  } while (((defVal[0] == '\0') && (found[0] != '\0')) &&
          ((iVar2 = bcmp(found,"root",5), iVar2 != 0 &&
           (isAvailable = (UBool *)0x0, *status < U_ILLEGAL_ARGUMENT_ERROR))));
  strcpy(parent,base);
  strcpy(found,base);
  do {
    subStatus = U_ZERO_ERROR;
    pUVar6 = ures_open_63(path,parent,&subStatus);
    if (subStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (((subStatus == U_ZERO_ERROR) &&
          (ures_getByKey_63(pUVar6,local_1dd8,&bund1,&subStatus), subStatus == U_ZERO_ERROR)) &&
         (ures_getByKey_63(&bund1,kwVal,&bund2,&subStatus), subStatus == U_ZERO_ERROR)) {
        strcpy(full,parent);
        if (full[0] == '\0') {
          builtin_strncpy(full,"root",5);
        }
        local_1de8 = (UChar *)strlen(defLoc);
        pUVar7 = (UChar *)strlen(full);
        if (((pUVar7 < local_1de8) &&
            (pUVar7 = ures_getStringByKey_63(&bund1,"default",&defLen,&subStatus),
            subStatus < U_ILLEGAL_ARGUMENT_ERROR)) && (defLen != 0)) {
          local_1de8 = pUVar7;
          iVar4 = u_strlen_63(pUVar7);
          u_UCharsToChars_63(local_1de8,defVal,iVar4);
          strcpy(defLoc,full);
        }
      }
    }
    else {
      *status = subStatus;
    }
    subStatus = U_ZERO_ERROR;
    strcpy(found,parent);
    uloc_getParent_63(found,parent,0x3ff,&subStatus);
    ures_close_63(pUVar6);
    if ((full[0] != '\0') || (found[0] == '\0')) {
      if (full[0] != '\0') {
        bVar11 = false;
        goto LAB_002db2e0;
      }
      break;
    }
  } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  iVar2 = strcmp(kwVal,defVal);
  if (iVar2 == 0) {
    bVar11 = true;
LAB_002db2e0:
    pcVar5 = local_1de0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (bVar11) {
        *status = U_MISSING_RESOURCE_ERROR;
      }
      else if (omitDefault != '\0') {
        sVar9 = strlen(defLoc);
        sVar8 = strlen(full);
        if ((sVar9 <= sVar8) && (iVar2 = strcmp(kwVal,defVal), iVar2 == 0)) {
          kwVal[0] = '\0';
          strcpy(found,full);
          goto LAB_002db433;
        }
      }
      cVar1 = kwVal[0];
      strcpy(found,full);
      if (cVar1 == '\0') {
        if (omitDefault == '\0') {
          sVar9 = strlen(found);
          (found + sVar9)[0] = '@';
          (found + sVar9)[1] = '\0';
          strcat(found,local_1de0);
          sVar9 = strlen(found);
          (found + sVar9)[0] = '=';
          (found + sVar9)[1] = '\0';
          strcat(found,defVal);
        }
      }
      else {
        sVar9 = strlen(found);
        (found + sVar9)[0] = '@';
        (found + sVar9)[1] = '\0';
        strcat(found,pcVar5);
        sVar9 = strlen(found);
        (found + sVar9)[0] = '=';
        (found + sVar9)[1] = '\0';
        strcat(found,kwVal);
      }
    }
  }
  else {
    strcpy(kwVal,defVal);
    strcpy(parent,base);
    strcpy(found,base);
    do {
      subStatus = U_ZERO_ERROR;
      pUVar6 = ures_open_63(path,parent,&subStatus);
      if (subStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        if (((subStatus == U_ZERO_ERROR) &&
            (ures_getByKey_63(pUVar6,local_1dd8,&bund1,&subStatus), subStatus == U_ZERO_ERROR)) &&
           (ures_getByKey_63(&bund1,kwVal,&bund2,&subStatus), subStatus == U_ZERO_ERROR)) {
          strcpy(full,parent);
          if (full[0] == '\0') {
            builtin_strncpy(full,"root",5);
          }
          local_1de8 = (UChar *)strlen(defLoc);
          pUVar7 = (UChar *)strlen(full);
          if (((pUVar7 < local_1de8) &&
              (pUVar7 = ures_getStringByKey_63(&bund1,"default",&defLen,&subStatus),
              subStatus < U_ILLEGAL_ARGUMENT_ERROR)) && (defLen != 0)) {
            local_1de8 = pUVar7;
            iVar4 = u_strlen_63(pUVar7);
            u_UCharsToChars_63(local_1de8,defVal,iVar4);
            strcpy(defLoc,full);
          }
        }
      }
      else {
        *status = subStatus;
      }
      subStatus = U_ZERO_ERROR;
      strcpy(found,parent);
      uloc_getParent_63(found,parent,0x3ff,&subStatus);
      ures_close_63(pUVar6);
      if ((full[0] != '\0') || (found[0] == '\0')) {
        bVar11 = full[0] == '\0';
        goto LAB_002db2e0;
      }
    } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  }
LAB_002db433:
  ures_close_63(&bund1);
  ures_close_63(&bund2);
  sVar9 = strlen(found);
  iVar4 = local_1dec;
  x = (int32_t)sVar9;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar3 = uprv_min_63(x,local_1dec);
    pcVar5 = local_1dd0;
    if (0 < (int)uVar3) {
      strncpy(local_1dd0,found,(ulong)uVar3);
    }
    if (x == 0) {
      *status = U_MISSING_RESOURCE_ERROR;
      x = 0;
    }
  }
  else {
    *local_1dd0 = '\0';
    x = 0;
    pcVar5 = local_1dd0;
  }
  iVar4 = u_terminateChars_63(pcVar5,iVar4,x,status);
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ures_getFunctionalEquivalent(char *result, int32_t resultCapacity,
                             const char *path, const char *resName, const char *keyword, const char *locid,
                             UBool *isAvailable, UBool omitDefault, UErrorCode *status)
{
    char kwVal[1024] = ""; /* value of keyword 'keyword' */
    char defVal[1024] = ""; /* default value for given locale */
    char defLoc[1024] = ""; /* default value for given locale */
    char base[1024] = ""; /* base locale */
    char found[1024];
    char parent[1024];
    char full[1024] = "";
    UResourceBundle bund1, bund2;
    UResourceBundle *res = NULL;
    UErrorCode subStatus = U_ZERO_ERROR;
    int32_t length = 0;
    if(U_FAILURE(*status)) return 0;
    uloc_getKeywordValue(locid, keyword, kwVal, 1024-1,&subStatus);
    if(!uprv_strcmp(kwVal, DEFAULT_TAG)) {
        kwVal[0]=0;
    }
    uloc_getBaseName(locid, base, 1024-1,&subStatus);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "getFunctionalEquivalent: \"%s\" [%s=%s] in %s - %s\n", 
            locid, keyword, kwVal, base, u_errorName(subStatus));
#endif
    ures_initStackObject(&bund1);
    ures_initStackObject(&bund2);
    
    
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);

    if(isAvailable) { 
        UEnumeration *locEnum = ures_openAvailableLocales(path, &subStatus);
        *isAvailable = TRUE;
        if (U_SUCCESS(subStatus)) {
            *isAvailable = isLocaleInList(locEnum, parent, &subStatus);
        }
        uenum_close(locEnum);
    }

    if(U_FAILURE(subStatus)) {
        *status = subStatus;
        return 0;
    }
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if(((subStatus == U_USING_FALLBACK_WARNING) ||
            (subStatus == U_USING_DEFAULT_WARNING)) && isAvailable)
        {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s [%s]\n", path?path:"ICUDATA", parent, u_errorName(subStatus), ures_getLocale(res, &subStatus));
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
            if(subStatus == U_ZERO_ERROR) {
                const UChar *defUstr;
                int32_t defLen;
                /* look for default item */
#if defined(URES_TREE_DEBUG)
                fprintf(stderr, "%s;%s : loaded default -> %s\n",
                    path?path:"ICUDATA", parent, u_errorName(subStatus));
#endif
                defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                if(U_SUCCESS(subStatus) && defLen) {
                    u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, defVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(defLoc, parent);
                    if(kwVal[0]==0) {
                        uprv_strcpy(kwVal, defVal);
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> kwVal =  %s\n", 
                            path?path:"ICUDATA", parent, keyword, kwVal);
#endif
                    }
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;

        if (res != NULL) {
            uprv_strcpy(found, ures_getLocaleByType(res, ULOC_VALID_LOCALE, &subStatus));
        }

        uloc_getParent(found,parent,sizeof(parent),&subStatus);
        ures_close(res);
    } while(!defVal[0] && *found && uprv_strcmp(found, "root") != 0 && U_SUCCESS(*status));
    
    /* Now, see if we can find the kwVal collator.. start the search over.. */
    uprv_strcpy(parent, base);
    uprv_strcpy(found, base);
    
    do {
        subStatus = U_ZERO_ERROR;
        res = ures_open(path, parent, &subStatus);
        if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
            *isAvailable = FALSE;
        }
        isAvailable = NULL; /* only want to set this the first time around */
        
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "%s;%s -> %s (looking for %s)\n", 
            path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
        if(U_FAILURE(subStatus)) {
            *status = subStatus;
        } else if(subStatus == U_ZERO_ERROR) {
            ures_getByKey(res,resName,&bund1, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, resName, u_errorName(subStatus));
#endif
            if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
#if defined(URES_TREE_DEBUG)
/**/ fprintf(stderr,"@%d [%s] %s\n", __LINE__, kwVal, u_errorName(subStatus));
#endif
                if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s;%s -> full0 %s=%s,  %s\n", 
                        path?path:"ICUDATA", parent, keyword, kwVal, u_errorName(subStatus));
#endif
                    uprv_strcpy(full, parent);
                    if(*full == 0) {
                        uprv_strcpy(full, "root");
                    }
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default0\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default0 %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim0,  %s <= %s\n", defLoc, full);
                        }
#endif
                } else {
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "err=%s in %s looking for %s\n", 
                        u_errorName(subStatus), parent, kwVal);
#endif
                }
            }
        }
        
        subStatus = U_ZERO_ERROR;
        
        uprv_strcpy(found, parent);
        uloc_getParent(found,parent,1023,&subStatus);
        ures_close(res);
    } while(!full[0] && *found && U_SUCCESS(*status));
    
    if((full[0]==0) && uprv_strcmp(kwVal, defVal)) {
#if defined(URES_TREE_DEBUG)
        fprintf(stderr, "Failed to locate kw %s - try default %s\n", kwVal, defVal);
#endif
        uprv_strcpy(kwVal, defVal);
        uprv_strcpy(parent, base);
        uprv_strcpy(found, base);
        
        do { /* search for 'default' named item */
            subStatus = U_ZERO_ERROR;
            res = ures_open(path, parent, &subStatus);
            if((subStatus == U_USING_FALLBACK_WARNING) && isAvailable) {
                *isAvailable = FALSE;
            }
            isAvailable = NULL; /* only want to set this the first time around */
            
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s;%s -> %s (looking for default %s)\n",
                path?path:"ICUDATA", parent, u_errorName(subStatus), kwVal);
#endif
            if(U_FAILURE(subStatus)) {
                *status = subStatus;
            } else if(subStatus == U_ZERO_ERROR) {
                ures_getByKey(res,resName,&bund1, &subStatus);
                if(subStatus == U_ZERO_ERROR) {
                    ures_getByKey(&bund1, kwVal, &bund2, &subStatus);
                    if(subStatus == U_ZERO_ERROR) {
#if defined(URES_TREE_DEBUG)
                        fprintf(stderr, "%s;%s -> full1 %s=%s,  %s\n", path?path:"ICUDATA",
                            parent, keyword, kwVal, u_errorName(subStatus));
#endif
                        uprv_strcpy(full, parent);
                        if(*full == 0) {
                            uprv_strcpy(full, "root");
                        }
                        
                        /* now, recalculate default kw if need be */
                        if(uprv_strlen(defLoc) > uprv_strlen(full)) {
                          const UChar *defUstr;
                          int32_t defLen;
                          /* look for default item */
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> recalculating Default1\n", 
                                    path?path:"ICUDATA", full);
#endif
                          defUstr = ures_getStringByKey(&bund1, DEFAULT_TAG, &defLen, &subStatus);
                          if(U_SUCCESS(subStatus) && defLen) {
                            u_UCharsToChars(defUstr, defVal, u_strlen(defUstr));
#if defined(URES_TREE_DEBUG)
                            fprintf(stderr, "%s;%s -> default %s=%s,  %s\n", 
                                    path?path:"ICUDATA", full, keyword, defVal, u_errorName(subStatus));
#endif
                            uprv_strcpy(defLoc, full);
                          }
                        } /* end of recalculate default KW */
#if defined(URES_TREE_DEBUG)
                        else {
                          fprintf(stderr, "No trim1,  %s <= %s\n", defLoc, full);
                        }
#endif
                    }
                }
            }
            subStatus = U_ZERO_ERROR;
            
            uprv_strcpy(found, parent);
            uloc_getParent(found,parent,1023,&subStatus);
            ures_close(res);
        } while(!full[0] && *found && U_SUCCESS(*status));
    }
    
    if(U_SUCCESS(*status)) {
        if(!full[0]) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr, "Still could not load keyword %s=%s\n", keyword, kwVal);
#endif
          *status = U_MISSING_RESOURCE_ERROR;
        } else if(omitDefault) {
#if defined(URES_TREE_DEBUG)
          fprintf(stderr,"Trim? full=%s, defLoc=%s, found=%s\n", full, defLoc, found);
#endif        
          if(uprv_strlen(defLoc) <= uprv_strlen(full)) {
            /* found the keyword in a *child* of where the default tag was present. */
            if(!uprv_strcmp(kwVal, defVal)) { /* if the requested kw is default, */
              /* and the default is in or in an ancestor of the current locale */
#if defined(URES_TREE_DEBUG)
              fprintf(stderr, "Removing unneeded var %s=%s\n", keyword, kwVal);
#endif
              kwVal[0]=0;
            }
          }
        }
        uprv_strcpy(found, full);
        if(kwVal[0]) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, kwVal);
        } else if(!omitDefault) {
            uprv_strcat(found, "@");
            uprv_strcat(found, keyword);
            uprv_strcat(found, "=");
            uprv_strcat(found, defVal);
        }
    }
    /* we found the default locale - no need to repeat it.*/
    
    ures_close(&bund1);
    ures_close(&bund2);
    
    length = (int32_t)uprv_strlen(found);

    if(U_SUCCESS(*status)) {
        int32_t copyLength = uprv_min(length, resultCapacity);
        if(copyLength>0) {
            uprv_strncpy(result, found, copyLength);
        }
        if(length == 0) {
          *status = U_MISSING_RESOURCE_ERROR; 
        }
    } else {
        length = 0;
        result[0]=0;
    }
    return u_terminateChars(result, resultCapacity, length, status);
}